

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O1

void tcg_dump_op_s390x(TCGContext_conflict12 *s,_Bool have_prefs,TCGOp *op)

{
  TCGArg *pTVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  undefined8 uVar5;
  FILE *pFVar6;
  uint uVar7;
  uint uVar8;
  gpointer pvVar9;
  ulong uVar10;
  undefined8 uVar11;
  char *pcVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  undefined8 *puVar17;
  ulong uVar18;
  uint uVar19;
  char buf [128];
  char local_b8 [136];
  
  pFVar6 = _stderr;
  uVar19 = *(uint *)op;
  uVar7 = uVar19 & 0xff;
  puVar17 = (undefined8 *)((long)&s->tcg_op_defs->name + (ulong)(uVar7 << 5));
  if ((byte)uVar19 == 2) {
    uVar7 = uVar19 >> 0xc & 0xf;
    uVar10 = (ulong)uVar7;
    uVar19 = uVar19 >> 8 & 0xf;
    uVar5 = *puVar17;
    if ((s->helper_table == (GHashTable *)0x0) ||
       (pvVar9 = g_hash_table_lookup(s->helper_table,(gconstpointer)op->args[uVar7 + uVar19]),
       pvVar9 == (gpointer)0x0)) {
      uVar11 = 0;
    }
    else {
      uVar11 = *(undefined8 *)((long)pvVar9 + 8);
    }
    fprintf(pFVar6," %s %s,$0x%lx,$%d",uVar5,uVar11,op->args[(ulong)(uVar7 + uVar19) + 1],uVar10);
    if (uVar7 != 0) {
      tcg_dump_op_s390x_cold_1();
    }
    if (uVar19 != 0) {
      uVar15 = 0;
      uVar18 = uVar10;
      do {
        pcVar12 = "<dummy>";
        if (op->args[uVar10 + uVar15] != 0) {
          tcg_get_arg_str(s,local_b8,(int)op->args[uVar10 + uVar15],uVar18);
          pcVar12 = local_b8;
        }
        fprintf(_stderr,",%s",pcVar12);
        uVar15 = uVar15 + 1;
      } while (uVar19 != uVar15);
    }
    goto LAB_00ca35ea;
  }
  if (uVar7 == 0x81) {
    tcg_dump_op_s390x_cold_2();
    uVar10 = 0;
    goto LAB_00ca35ea;
  }
  uVar15 = 0;
  fprintf(_stderr," %s ",*puVar17);
  bVar2 = *(byte *)(puVar17 + 1);
  uVar10 = (ulong)bVar2;
  bVar3 = *(byte *)((long)puVar17 + 9);
  uVar13 = (uint)bVar3;
  bVar4 = *(byte *)((long)puVar17 + 10);
  uVar18 = (ulong)bVar4;
  if ((*(byte *)((long)puVar17 + 0xc) & 0x40) != 0) {
    tcg_dump_op_s390x_cold_3();
  }
  if (bVar2 != 0) {
    uVar15 = 0;
    do {
      if (uVar15 != 0) {
        fputc(0x2c,_stderr);
      }
      pFVar6 = _stderr;
      pTVar1 = op->args + uVar15;
      uVar15 = uVar15 + 1;
      tcg_get_arg_str(s,local_b8,(int)*pTVar1,uVar18);
      fputs(local_b8,pFVar6);
    } while (uVar10 != uVar15);
  }
  if (bVar3 != 0) {
    uVar15 = uVar15 & 0xffffffff;
    do {
      if (uVar15 != 0) {
        fputc(0x2c,_stderr);
      }
      pFVar6 = _stderr;
      pTVar1 = op->args + uVar15;
      uVar15 = uVar15 + 1;
      tcg_get_arg_str(s,local_b8,(int)*pTVar1,uVar18);
      fputs(local_b8,pFVar6);
      uVar13 = uVar13 - 1;
    } while (uVar13 != 0);
  }
  uVar8 = uVar19 & 0xff;
  uVar13 = 0;
  if (uVar8 < 0x85) {
    if (((uVar8 - 7 < 0x3c) && ((0xc0000c080000003U >> ((ulong)(uVar8 - 7) & 0x3f) & 1) != 0)) ||
       (uVar13 = 0, uVar8 == 0x67)) {
LAB_00ca33cf:
      if (((uint)op->args[uVar15 & 0xffffffff] & 0xe) == 6 || 0xd < op->args[uVar15 & 0xffffffff]) {
        fprintf(_stderr,",$0x%lx");
      }
      else {
        tcg_dump_op_s390x_cold_5();
      }
      uVar15 = (ulong)((int)uVar15 + 1);
LAB_00ca34e8:
      uVar13 = 1;
    }
  }
  else {
    if (uVar8 - 0x85 < 4) {
      uVar18 = uVar15 & 0xffffffff;
      uVar15 = (ulong)((int)uVar15 + 1);
      uVar13 = (uint)op->args[uVar18];
      if (uVar13 < 0x800) {
        tcg_dump_op_s390x_cold_4();
      }
      else {
        fprintf(_stderr,",$0x%x,%u",op->args[uVar18] >> 4 & 0xfffffff,(ulong)(uVar13 & 0xf));
      }
      goto LAB_00ca34e8;
    }
    if ((uVar8 == 0xae) || (uVar8 == 0xac)) goto LAB_00ca33cf;
  }
  if ((((byte)uVar19 < 0x2e) && ((0x20400000000aU >> ((ulong)(uVar19 & 0xff) & 0x3f) & 1) != 0)) ||
     ((uVar19 & 0xff) == 0x67)) {
    iVar14 = (int)uVar15;
    pcVar12 = ",";
    if (iVar14 == 0) {
      pcVar12 = "";
    }
    fprintf(_stderr,"%s$L%d",pcVar12,(ulong)(*(uint *)op->args[iVar14] >> 2 & 0x3fff));
    uVar13 = uVar13 + 1;
    uVar15 = (ulong)(iVar14 + 1);
  }
  if (uVar13 < bVar4) {
    lVar16 = 0;
    do {
      pcVar12 = ",";
      if (-lVar16 == (uVar15 & 0xffffffff)) {
        pcVar12 = "";
      }
      fprintf(_stderr,"%s$0x%lx",pcVar12,op->args[(uVar15 & 0xffffffff) + lVar16]);
      lVar16 = lVar16 + 1;
    } while (bVar4 - uVar13 != (int)lVar16);
  }
  if (((uVar7 == 0x3f) && (op->args[1] != 0)) && (*(char *)(op->args[1] + 1) == '\x02')) {
    tcg_dump_op_s390x_cold_6();
  }
LAB_00ca35ea:
  uVar19 = *(uint *)op;
  if (0xffff < uVar19) {
    if ((uVar19 & 0x30000) != 0) {
      tcg_dump_op_s390x_cold_7();
    }
    if (0x3ffff < uVar19) {
      tcg_dump_op_s390x_cold_8();
    }
  }
  if ((have_prefs) && ((int)uVar10 != 0)) {
    uVar18 = 0;
    do {
      uVar19 = op->output_pref[uVar18];
      if (uVar18 == 0) {
        tcg_dump_op_s390x_cold_9();
      }
      else {
        fputc(0x2c,_stderr);
      }
      if (uVar19 == 0xffffffff) {
        tcg_dump_op_s390x_cold_10();
      }
      else if (uVar19 == 0) {
        tcg_dump_op_s390x_cold_11();
      }
      else {
        fprintf(_stderr,"%#x",(ulong)uVar19);
      }
      uVar18 = uVar18 + 1;
    } while (uVar10 != uVar18);
  }
  fputc(10,_stderr);
  return;
}

Assistant:

void tcg_dump_op(TCGContext *s, bool have_prefs, TCGOp* op)
{
    char buf[128];
    int i, k, nb_oargs, nb_iargs, nb_cargs;
    const TCGOpDef *def;
    TCGOpcode c;

    c = op->opc;
    def = &s->tcg_op_defs[c];
    if (c == INDEX_op_insn_start) {
        nb_oargs = 0;
        fprintf(stderr, " ----");

        for (i = 0; i < TARGET_INSN_START_WORDS; ++i) {
            target_ulong a;
#if TARGET_LONG_BITS > TCG_TARGET_REG_BITS
            a = deposit64(op->args[i * 2], 32, 32, op->args[i * 2 + 1]);
#else
            a = op->args[i];
#endif
            fprintf(stderr, " " TARGET_FMT_lx, a);
        }
    } else if (c == INDEX_op_call) {
        /* variable number of arguments */
        nb_oargs = TCGOP_CALLO(op);
        nb_iargs = TCGOP_CALLI(op);
        nb_cargs = def->nb_cargs;

        /* function name, flags, out args */
        fprintf(stderr, " %s %s,$0x%" TCG_PRIlx ",$%d", def->name,
                      tcg_find_helper(s, op->args[nb_oargs + nb_iargs]),
                      op->args[nb_oargs + nb_iargs + 1], nb_oargs);
        for (i = 0; i < nb_oargs; i++) {
            fprintf(stderr, ",%s", tcg_get_arg_str(s, buf, sizeof(buf),
                                                 op->args[i]));
        }
        for (i = 0; i < nb_iargs; i++) {
            TCGArg arg = op->args[nb_oargs + i];
            const char *t = "<dummy>";
            if (arg != TCG_CALL_DUMMY_ARG) {
                t = tcg_get_arg_str(s, buf, sizeof(buf), arg);
            }
            fprintf(stderr, ",%s", t);
        }
    } else {
        fprintf(stderr, " %s ", def->name);

        nb_oargs = def->nb_oargs;
        nb_iargs = def->nb_iargs;
        nb_cargs = def->nb_cargs;

        if (def->flags & TCG_OPF_VECTOR) {
            fprintf(stderr, "v%d,e%d,", 64 << TCGOP_VECL(op),
                          8 << TCGOP_VECE(op));
        }

        k = 0;
        for (i = 0; i < nb_oargs; i++) {
            if (k != 0) {
                fprintf(stderr, ",");
            }
            fprintf(stderr, "%s", tcg_get_arg_str(s, buf, sizeof(buf),
                                                op->args[k++]));
        }
        for (i = 0; i < nb_iargs; i++) {
            if (k != 0) {
                fprintf(stderr, ",");
            }
            fprintf(stderr, "%s", tcg_get_arg_str(s, buf, sizeof(buf),
                                                op->args[k++]));
        }
        switch (c) {
            case INDEX_op_brcond_i32:
            case INDEX_op_setcond_i32:
            case INDEX_op_movcond_i32:
            case INDEX_op_brcond2_i32:
            case INDEX_op_setcond2_i32:
            case INDEX_op_brcond_i64:
            case INDEX_op_setcond_i64:
            case INDEX_op_movcond_i64:
            case INDEX_op_cmp_vec:
            case INDEX_op_cmpsel_vec:
                if (op->args[k] < ARRAY_SIZE(cond_name)
                    && cond_name[op->args[k]]) {
                    fprintf(stderr, ",%s", cond_name[op->args[k++]]);
                } else {
                    fprintf(stderr, ",$0x%" TCG_PRIlx, op->args[k++]);
                }
                i = 1;
                break;
            case INDEX_op_qemu_ld_i32:
            case INDEX_op_qemu_st_i32:
            case INDEX_op_qemu_ld_i64:
            case INDEX_op_qemu_st_i64:
            {
                TCGMemOpIdx oi = op->args[k++];
                MemOp op = get_memop(oi);
                unsigned ix = get_mmuidx(oi);

                if (op & ~(MO_AMASK | MO_BSWAP | MO_SSIZE)) {
                    fprintf(stderr, ",$0x%x,%u", op, ix);
                } else {
                    const char *s_al, *s_op;
                    s_al = alignment_name[(op & MO_AMASK) >> MO_ASHIFT];
                    s_op = ldst_name[op & (MO_BSWAP | MO_SSIZE)];
                    fprintf(stderr, ",%s%s,%u", s_al, s_op, ix);
                }
                i = 1;
            }
                break;
            default:
                i = 0;
                break;
        }
        switch (c) {
            case INDEX_op_set_label:
            case INDEX_op_br:
            case INDEX_op_brcond_i32:
            case INDEX_op_brcond_i64:
            case INDEX_op_brcond2_i32:
                fprintf(stderr, "%s$L%d", k ? "," : "",
                              arg_label(op->args[k])->id);
                i++, k++;
                break;
            default:
                break;
        }
        for (; i < nb_cargs; i++, k++) {
            fprintf(stderr, "%s$0x%" TCG_PRIlx, k ? "," : "", op->args[k]);
        }
        if(c == INDEX_op_mov_i64){
            struct TCGTemp* tp = arg_temp(op->args[1]);
            if (tp && tp->val_type == TEMP_VAL_MEM){
                fprintf(stderr, " mem_base=%p ", tp->mem_base);
            }
        }
    }

    if (op->life) {
        unsigned life = op->life;

        if (life & (SYNC_ARG * 3)) {
            fprintf(stderr, "  sync:");
            for (i = 0; i < 2; ++i) {
                if (life & (SYNC_ARG << i)) {
                    fprintf(stderr, " %d", i);
                }
            }
        }
        life /= DEAD_ARG;
        if (life) {
            fprintf(stderr, "  dead:");
            for (i = 0; life; ++i, life >>= 1) {
                if (life & 1) {
                    fprintf(stderr, " %d", i);
                }
            }
        }
    }

    if (have_prefs) {
        for (i = 0; i < nb_oargs; ++i) {
            TCGRegSet set = op->output_pref[i];

            if (i == 0) {
                fprintf(stderr, "  pref=");
            } else {
                fprintf(stderr, ",");
            }
            if (set == 0) {
                fprintf(stderr, "none");
            } else if (set == MAKE_64BIT_MASK(0, TCG_TARGET_NB_REGS)) {
                fprintf(stderr, "all");
#ifdef CONFIG_DEBUG_TCG
                } else if (tcg_regset_single(set)) {
                    TCGReg reg = tcg_regset_first(set);
                    fprintf(stderr, "%s", tcg_target_reg_names[reg]);
#endif
            } else if (TCG_TARGET_NB_REGS <= 32) {
                fprintf(stderr, "%#x", (uint32_t)set);
            } else {
                fprintf(stderr, "%#" PRIx64, (uint64_t)set);
            }
        }
    }

    fprintf(stderr, "\n");
}